

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

void VP8LBackwardRefsClear(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  VP8LBackwardRefs *in_RDI;
  PixOrCopyBlock *next;
  
  VP8LClearBackwardRefs(in_RDI);
  while (in_RDI->free_blocks_ != (PixOrCopyBlock *)0x0) {
    pPVar1 = in_RDI->free_blocks_->next_;
    WebPSafeFree((void *)0x18f85e);
    in_RDI->free_blocks_ = pPVar1;
  }
  return;
}

Assistant:

void VP8LBackwardRefsClear(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  VP8LClearBackwardRefs(refs);
  while (refs->free_blocks_ != NULL) {
    PixOrCopyBlock* const next = refs->free_blocks_->next_;
    WebPSafeFree(refs->free_blocks_);
    refs->free_blocks_ = next;
  }
}